

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

JavascriptArray *
ByteCodeGenerator::BuildArrayFromStringList
          (ParseNode *stringNodeList,uint arrayLength,ScriptContext *scriptContext)

{
  Ident *pIVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  JavascriptLibrary *this;
  JavascriptArray *pJVar6;
  ParseNodeBin *pPVar7;
  ParseNodeStr *pPVar8;
  LPCOLESTR pOVar9;
  JavascriptString *pJVar10;
  JavascriptArray *pArr;
  IdentPtr pid;
  Var str;
  uint index;
  ScriptContext *scriptContext_local;
  ParseNodePtr pPStack_10;
  uint arrayLength_local;
  ParseNode *stringNodeList_local;
  
  if (stringNodeList == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x252,"(stringNodeList)","stringNodeList");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  str._4_4_ = 0;
  this = Js::ScriptContext::GetLibrary(scriptContext);
  pJVar6 = Js::JavascriptLibrary::CreateArray(this,arrayLength);
  pPStack_10 = stringNodeList;
  do {
    if (pPStack_10->nop != knopList) {
      if (pPStack_10->nop != knopStr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x265,"(stringNodeList->nop == knopStr)",
                           "stringNodeList->nop == knopStr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pPVar8 = ParseNode::AsParseNodeStr(pPStack_10);
      pIVar1 = pPVar8->pid;
      pOVar9 = Ident::Psz(pIVar1);
      uVar4 = Ident::Cch(pIVar1);
      pJVar10 = Js::JavascriptString::NewCopyBuffer(pOVar9,uVar4,scriptContext);
      (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])
                (pJVar6,(ulong)str._4_4_,pJVar10,1);
      return pJVar6;
    }
    pPVar7 = ParseNode::AsParseNodeBin(pPStack_10);
    if (pPVar7->pnode1->nop != knopStr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x25b,"(stringNodeList->AsParseNodeBin()->pnode1->nop == knopStr)",
                         "stringNodeList->AsParseNodeBin()->pnode1->nop == knopStr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pPVar7 = ParseNode::AsParseNodeBin(pPStack_10);
    pPVar8 = ParseNode::AsParseNodeStr(pPVar7->pnode1);
    pIVar1 = pPVar8->pid;
    pOVar9 = Ident::Psz(pIVar1);
    uVar4 = Ident::Cch(pIVar1);
    pJVar10 = Js::JavascriptString::NewCopyBuffer(pOVar9,uVar4,scriptContext);
    (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])
              (pJVar6,(ulong)str._4_4_,pJVar10,1);
    pPVar7 = ParseNode::AsParseNodeBin(pPStack_10);
    pPStack_10 = pPVar7->pnode2;
    str._4_4_ = str._4_4_ + 1;
  } while( true );
}

Assistant:

Js::JavascriptArray* ByteCodeGenerator::BuildArrayFromStringList(ParseNode* stringNodeList, uint arrayLength, Js::ScriptContext* scriptContext)
{
    Assert(stringNodeList);

    uint index = 0;
    Js::Var str;
    IdentPtr pid;
    Js::JavascriptArray* pArr = scriptContext->GetLibrary()->CreateArray(arrayLength);

    while (stringNodeList->nop == knopList)
    {
        Assert(stringNodeList->AsParseNodeBin()->pnode1->nop == knopStr);

        pid = stringNodeList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid;
        str = Js::JavascriptString::NewCopyBuffer(pid->Psz(), pid->Cch(), scriptContext);
        pArr->SetItemWithAttributes(index, str, PropertyEnumerable);

        stringNodeList = stringNodeList->AsParseNodeBin()->pnode2;
        index++;
    }

    Assert(stringNodeList->nop == knopStr);

    pid = stringNodeList->AsParseNodeStr()->pid;
    str = Js::JavascriptString::NewCopyBuffer(pid->Psz(), pid->Cch(), scriptContext);
    pArr->SetItemWithAttributes(index, str, PropertyEnumerable);

    return pArr;
}